

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

int __thiscall StatisticsApp::run(StatisticsApp *this)

{
  ostream *stream;
  double dVar1;
  ulong index;
  byte bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  ostream *poVar6;
  ostream *extraout_RAX;
  ostream *extraout_RAX_00;
  ostream *extraout_RAX_01;
  ostream *extraout_RAX_02;
  ostream *extraout_RAX_03;
  ostream *extraout_RAX_04;
  ostream *extraout_RAX_05;
  ostream *extraout_RAX_06;
  ostream *extraout_RAX_07;
  ostream *extraout_RAX_08;
  ostream *extraout_RAX_09;
  ostream *extraout_RAX_10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *data_00;
  ostream *extraout_RAX_11;
  reference pvVar7;
  string *psVar8;
  ostream *extraout_RAX_12;
  ostream *extraout_RAX_13;
  size_type sVar9;
  ostream *extraout_RAX_14;
  reference pvVar10;
  long lVar11;
  ostream *extraout_RAX_15;
  istream *extraout_RDX;
  istream *stream_00;
  istream *extraout_RDX_00;
  vector<bool,_std::allocator<bool>_> *pvVar12;
  iterator iVar13;
  _Bit_iterator __first;
  _Bit_iterator __last;
  StatisticsApp *local_2148;
  string local_2130 [32];
  stringstream local_2110 [8];
  stringstream msg_16;
  ostream local_2100 [376];
  string local_1f88;
  size_type local_1f68;
  long i_2;
  size_type local_1f40;
  long i_1;
  value_type local_1f30;
  string local_1f10 [32];
  stringstream local_1ef0 [8];
  stringstream msg_15;
  ostream local_1ee0 [383];
  allocator<char> local_1d61;
  string local_1d60;
  long local_1d40;
  long local_1d38;
  long local_1d30;
  string local_1d28 [32];
  stringstream local_1d08 [8];
  stringstream msg_14;
  ostream local_1cf8 [383];
  undefined1 local_1b79;
  string local_1b78 [7];
  bool isNumericFiltered;
  stringstream local_1b58 [8];
  stringstream msg_13;
  ostream local_1b48 [376];
  ulong local_19d0;
  size_type i;
  stringstream local_19a8 [8];
  stringstream msg_12;
  ostream local_1998 [383];
  undefined1 local_1819;
  string local_1818 [7];
  bool isStringFiltered;
  stringstream local_17f8 [8];
  stringstream msg_11;
  ostream local_17e8 [376];
  string local_1670 [32];
  stringstream local_1650 [8];
  stringstream msg_10;
  ostream local_1640 [383];
  undefined1 local_14c1;
  string local_14c0 [7];
  bool isDimFailed;
  stringstream local_14a0 [8];
  stringstream msg_9;
  ostream local_1490 [376];
  string local_1318 [32];
  stringstream local_12f8 [8];
  stringstream msg_8;
  ostream local_12e8 [376];
  _Bit_type *local_1170;
  uint local_1168;
  _Bit_type *local_1160;
  uint local_1158;
  _Bit_type *local_1150;
  uint local_1148;
  _Bit_type *local_1140;
  uint local_1138;
  undefined1 local_1129;
  string local_1128 [7];
  bool isDimSet;
  stringstream local_1108 [8];
  stringstream msg_7;
  ostream local_10f8 [376];
  size_type local_f80;
  size_type numTokens;
  uint uStack_f70;
  undefined4 uStack_f6c;
  _Bit_type *local_f68;
  undefined8 uStack_f60;
  _Bit_pointer local_f58;
  string local_f48 [32];
  stringstream local_f28 [8];
  stringstream msg_6;
  ostream local_f18 [376];
  string local_da0 [32];
  stringstream local_d80 [8];
  stringstream msg_5;
  ostream local_d70 [376];
  string local_bf8 [32];
  stringstream local_bd8 [8];
  stringstream msg_4;
  ostream local_bc8 [376];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a50;
  byte local_a32;
  allocator<char> local_a31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a10;
  string local_9f0 [32];
  stringstream local_9d0 [8];
  stringstream msg_3;
  ostream local_9c0 [376];
  string local_848 [32];
  stringstream local_828 [8];
  stringstream msg_2;
  ostream local_818 [380];
  int local_69c;
  string local_698 [32];
  stringstream local_678 [8];
  stringstream msg_1;
  ostream local_668 [376];
  undefined1 local_4f0 [8];
  string line;
  undefined1 local_4c8 [7];
  bool reading;
  DataVector dataMasked;
  DataVector data;
  string local_490 [8];
  string lineToReshape;
  uint counterSinceLastParsing;
  uint counter;
  StringSplitter parser;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  titles;
  RowSampler sampler;
  undefined1 local_400 [8];
  StatisticsWriter writer;
  stringstream local_3c0 [8];
  stringstream msg;
  ostream local_3b0 [392];
  StatisticsApp *local_228;
  istream *source;
  ifstream fileInput;
  int local_18;
  int local_14;
  int numDimMask;
  int numDim;
  StatisticsApp *this_local;
  
  local_14 = 0;
  local_18 = 0;
  pcVar5 = (char *)std::__cxx11::string::c_str((string *)&(this->_options).fileInput);
  std::ifstream::ifstream((ifstream *)&source,pcVar5,_S_in);
  bVar2 = std::ios::good((ios *)((long)&source + *(long *)(source + -0x18)));
  if ((bVar2 & 1) == 0) {
    local_2148 = (StatisticsApp *)&std::cin;
  }
  else {
    local_2148 = (StatisticsApp *)&source;
  }
  local_228 = local_2148;
  if (2 < (int)Logger::logLevel) {
    std::__cxx11::stringstream::stringstream(local_3c0);
    poVar6 = std::operator<<(local_3b0,(string *)&ApplicationProperties::NAME_abi_cxx11_);
    poVar6 = std::operator<<(poVar6," is starting");
    dVar1 = (double)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    Logger::log(dVar1);
    std::__cxx11::stringstream::str();
    std::operator<<(extraout_RAX,(string *)(writer._comment.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(writer._comment.field_2._M_local_buf + 8));
    std::__cxx11::stringstream::~stringstream(local_3c0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sampler._step,"#",(allocator<char> *)((long)&sampler._sampled + 3));
  StatisticsWriter::StatisticsWriter((StatisticsWriter *)local_400,(string *)&sampler._step);
  std::__cxx11::string::~string((string *)&sampler._step);
  std::allocator<char>::~allocator((allocator<char> *)((long)&sampler._sampled + 3));
  RowSampler::RowSampler
            ((RowSampler *)
             &titles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&(this->_options).sampling);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&parser._tokens.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  StringSplitter::StringSplitter((StringSplitter *)&counterSinceLastParsing);
  lineToReshape.field_2._12_4_ = 0;
  lineToReshape.field_2._8_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_490,"",
             (allocator<char> *)
             ((long)&data.super_vector<DataPoint,_std::allocator<DataPoint>_>.
                     super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&data.super_vector<DataPoint,_std::allocator<DataPoint>_>.
                     super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  DataVector::DataVector
            ((DataVector *)
             &dataMasked.super_vector<DataPoint,_std::allocator<DataPoint>_>.
              super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  DataVector::DataVector((DataVector *)local_4c8);
  line.field_2._M_local_buf[0xf] = '\x01';
  stream_00 = extraout_RDX;
  do {
    if ((line.field_2._M_local_buf[0xf] & 1U) == 0) break;
    readline_abi_cxx11_((string *)local_4f0,local_228,stream_00);
    bVar2 = std::ios::good((ios *)(&(local_228->_options).blankEOF +
                                  *(long *)(*(long *)&local_228->_options + -0x18)));
    if ((bVar2 & 1) == 0) {
      if (4 < (int)Logger::logLevel) {
        std::__cxx11::stringstream::stringstream(local_678);
        poVar6 = std::operator<<(local_668,"End of file found. Exiting.");
        dVar1 = (double)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        Logger::log(dVar1);
        std::__cxx11::stringstream::str();
        std::operator<<(extraout_RAX_00,local_698);
        std::__cxx11::string::~string(local_698);
        std::__cxx11::stringstream::~stringstream(local_678);
      }
      local_69c = 3;
    }
    else {
      lVar11 = std::__cxx11::string::size((string *)local_4f0);
      if (lVar11 == 0) {
        if (((this->_options).blankEOF & 1U) == 0) {
          if (4 < (int)Logger::logLevel) {
            std::__cxx11::stringstream::stringstream(local_9d0);
            poVar6 = std::operator<<(local_9c0,"Blank line found. Skipping.");
            dVar1 = (double)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            Logger::log(dVar1);
            std::__cxx11::stringstream::str();
            std::operator<<(extraout_RAX_02,local_9f0);
            std::__cxx11::string::~string(local_9f0);
            std::__cxx11::stringstream::~stringstream(local_9d0);
          }
          local_69c = 2;
        }
        else {
          if (4 < (int)Logger::logLevel) {
            std::__cxx11::stringstream::stringstream(local_828);
            poVar6 = std::operator<<(local_818,"Blank line found. Exiting.");
            dVar1 = (double)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            Logger::log(dVar1);
            std::__cxx11::stringstream::str();
            std::operator<<(extraout_RAX_01,local_848);
            std::__cxx11::string::~string(local_848);
            std::__cxx11::stringstream::~stringstream(local_828);
          }
          local_69c = 3;
        }
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::c_str((string *)&(this->_options).comment);
        iVar4 = std::__cxx11::string::compare((string *)local_4f0,0,1,pcVar5);
        if (iVar4 == 0) {
          local_69c = 2;
        }
        else {
          lineToReshape.field_2._8_4_ = lineToReshape.field_2._8_4_ + 1;
          local_a32 = 0;
          if (lineToReshape.field_2._8_4_ == 1) {
            std::allocator<char>::allocator();
            local_a32 = 1;
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_a30,"",&local_a31);
          }
          else {
            std::__cxx11::string::string((string *)&local_a30,(string *)&(this->_options).delimiter)
            ;
          }
          std::operator+(&local_a10,&local_a30,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4f0);
          std::__cxx11::string::operator+=(local_490,(string *)&local_a10);
          std::__cxx11::string::~string((string *)&local_a10);
          std::__cxx11::string::~string((string *)&local_a30);
          if ((local_a32 & 1) != 0) {
            std::allocator<char>::~allocator(&local_a31);
          }
          if ((uint)lineToReshape.field_2._8_4_ < (this->_options).numLinesToReshape) {
            local_69c = 2;
          }
          else {
            std::__cxx11::string::operator=((string *)local_4f0,local_490);
            lineToReshape.field_2._12_4_ = lineToReshape.field_2._12_4_ + 1;
            lineToReshape.field_2._8_4_ = 0;
            std::__cxx11::string::operator=(local_490,"");
            if ((this->_options).headerRow == lineToReshape.field_2._12_4_) {
              StringSplitter::initialize
                        ((StringSplitter *)&counterSinceLastParsing,(string *)local_4f0,
                         &(this->_options).delimiter,(bool)((this->_options).removeDuplicates & 1),
                         &(this->_options).filterColumns);
              StringSplitter::tokens_abi_cxx11_
                        (&local_a50,(StringSplitter *)&counterSinceLastParsing);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&parser._tokens.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_a50);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_a50);
              local_69c = 2;
            }
            else if ((this->_options).numLinesToSkip < (uint)lineToReshape.field_2._12_4_) {
              if ((this->_options).numLinesToSkip + (this->_options).numLinesToKeep <
                  (uint)lineToReshape.field_2._12_4_) {
                if (2 < (int)Logger::logLevel) {
                  std::__cxx11::stringstream::stringstream(local_d80);
                  poVar6 = std::operator<<(local_d70,"Skipping remaining lines.");
                  dVar1 = (double)std::ostream::operator<<
                                            (poVar6,std::endl<char,std::char_traits<char>>);
                  Logger::log(dVar1);
                  std::__cxx11::stringstream::str();
                  std::operator<<(extraout_RAX_04,local_da0);
                  std::__cxx11::string::~string(local_da0);
                  std::__cxx11::stringstream::~stringstream(local_d80);
                }
                local_69c = 3;
              }
              else {
                bVar3 = RowSampler::sample((RowSampler *)
                                           &titles.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                if (bVar3) {
                  bVar3 = (this->_options).removeDuplicates;
                  local_f68 = (_Bit_type *)0x0;
                  uStack_f60._0_4_ = 0;
                  uStack_f60._4_4_ = 0;
                  numTokens = 0;
                  uStack_f70 = 0;
                  uStack_f6c = 0;
                  local_f58 = (_Bit_pointer)0x0;
                  std::vector<bool,_std::allocator<bool>_>::vector
                            ((vector<bool,_std::allocator<bool>_> *)&numTokens);
                  StringSplitter::initialize
                            ((StringSplitter *)&counterSinceLastParsing,(string *)local_4f0,
                             &(this->_options).delimiter,(bool)(bVar3 & 1),
                             (vector<bool,_std::allocator<bool>_> *)&numTokens);
                  std::vector<bool,_std::allocator<bool>_>::~vector
                            ((vector<bool,_std::allocator<bool>_> *)&numTokens);
                  local_f80 = StringSplitter::size((StringSplitter *)&counterSinceLastParsing);
                  if (4 < (int)Logger::logLevel) {
                    std::__cxx11::stringstream::stringstream(local_1108);
                    poVar6 = std::operator<<(local_10f8,"Line = ");
                    poVar6 = (ostream *)
                             std::ostream::operator<<(poVar6,lineToReshape.field_2._12_4_);
                    poVar6 = std::operator<<(poVar6," - content =\"");
                    poVar6 = std::operator<<(poVar6,(string *)local_4f0);
                    poVar6 = std::operator<<(poVar6,"\"");
                    dVar1 = (double)std::ostream::operator<<
                                              (poVar6,std::endl<char,std::char_traits<char>>);
                    Logger::log(dVar1);
                    std::__cxx11::stringstream::str();
                    std::operator<<(extraout_RAX_06,local_1128);
                    std::__cxx11::string::~string(local_1128);
                    std::__cxx11::stringstream::~stringstream(local_1108);
                  }
                  local_1129 = 0 < local_14;
                  if (!(bool)local_1129) {
                    iVar4 = (int)local_f80;
                    local_14 = (int)local_f80;
                    std::vector<DataPoint,_std::allocator<DataPoint>_>::resize
                              ((vector<DataPoint,_std::allocator<DataPoint>_> *)
                               &dataMasked.super_vector<DataPoint,_std::allocator<DataPoint>_>.
                                super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(long)(int)local_f80);
                    pvVar12 = &(this->_options).filterColumns;
                    sVar9 = std::vector<bool,_std::allocator<bool>_>::size(pvVar12);
                    std::vector<bool,_std::allocator<bool>_>::resize(pvVar12,(long)iVar4,sVar9 == 0)
                    ;
                    pvVar12 = &(this->_options).filterColumns;
                    iVar13 = std::vector<bool,_std::allocator<bool>_>::begin(pvVar12);
                    local_1150 = iVar13.super__Bit_iterator_base._M_p;
                    local_1148 = iVar13.super__Bit_iterator_base._M_offset;
                    local_1140 = local_1150;
                    local_1138 = local_1148;
                    iVar13 = std::vector<bool,_std::allocator<bool>_>::end(pvVar12);
                    local_1170 = iVar13.super__Bit_iterator_base._M_p;
                    local_1168 = iVar13.super__Bit_iterator_base._M_offset;
                    __first.super__Bit_iterator_base._M_offset = local_1138;
                    __first.super__Bit_iterator_base._M_p = local_1140;
                    __first.super__Bit_iterator_base._12_4_ = 0;
                    __last.super__Bit_iterator_base._12_4_ = 0;
                    __last.super__Bit_iterator_base._M_p =
                         (_Bit_type *)SUB128(iVar13.super__Bit_iterator_base._0_12_,0);
                    __last.super__Bit_iterator_base._M_offset =
                         SUB124(iVar13.super__Bit_iterator_base._0_12_,8);
                    local_1160 = local_1170;
                    local_1158 = local_1168;
                    local_18 = std::accumulate<std::_Bit_iterator,int>(__first,__last,0);
                    std::vector<DataPoint,_std::allocator<DataPoint>_>::resize
                              ((vector<DataPoint,_std::allocator<DataPoint>_> *)local_4c8,
                               (long)local_18);
                    if (2 < (int)Logger::logLevel) {
                      std::__cxx11::stringstream::stringstream(local_12f8);
                      poVar6 = std::operator<<(local_12e8,"Data dimensions set to ");
                      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
                      dVar1 = (double)std::ostream::operator<<
                                                (poVar6,std::endl<char,std::char_traits<char>>);
                      Logger::log(dVar1);
                      std::__cxx11::stringstream::str();
                      std::operator<<(extraout_RAX_07,local_1318);
                      std::__cxx11::string::~string(local_1318);
                      std::__cxx11::stringstream::~stringstream(local_12f8);
                    }
                    if (2 < (int)Logger::logLevel) {
                      std::__cxx11::stringstream::stringstream(local_14a0);
                      poVar6 = std::operator<<(local_1490,"Mask dimensions set to ");
                      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_18);
                      dVar1 = (double)std::ostream::operator<<
                                                (poVar6,std::endl<char,std::char_traits<char>>);
                      Logger::log(dVar1);
                      std::__cxx11::stringstream::str();
                      std::operator<<(extraout_RAX_08,local_14c0);
                      std::__cxx11::string::~string(local_14c0);
                      std::__cxx11::stringstream::~stringstream(local_14a0);
                    }
                  }
                  local_14c1 = local_14 != (int)local_f80;
                  if ((bool)local_14c1) {
                    if (1 < (int)Logger::logLevel) {
                      std::__cxx11::stringstream::stringstream(local_1650);
                      poVar6 = std::operator<<(local_1640,"Line = ");
                      poVar6 = (ostream *)
                               std::ostream::operator<<(poVar6,lineToReshape.field_2._12_4_);
                      poVar6 = std::operator<<(poVar6,
                                               " - Statistics dimensions does not equal data dimensions."
                                              );
                      pcVar5 = "";
                      if (((this->_options).strictParsing & 1U) != 0) {
                        pcVar5 = " Skipping.";
                      }
                      poVar6 = std::operator<<(poVar6,pcVar5);
                      dVar1 = (double)std::ostream::operator<<
                                                (poVar6,std::endl<char,std::char_traits<char>>);
                      Logger::log(dVar1);
                      std::__cxx11::stringstream::str();
                      std::operator<<(extraout_RAX_09,local_1670);
                      std::__cxx11::string::~string(local_1670);
                      std::__cxx11::stringstream::~stringstream(local_1650);
                    }
                    if (((this->_options).strictParsing & 1U) != 0) {
                      local_69c = 2;
                      goto LAB_00192c7d;
                    }
                  }
                  if (3 < (int)Logger::logLevel) {
                    std::__cxx11::stringstream::stringstream(local_17f8);
                    poVar6 = std::operator<<(local_17e8,"Line = ");
                    poVar6 = (ostream *)
                             std::ostream::operator<<(poVar6,lineToReshape.field_2._12_4_);
                    poVar6 = std::operator<<(poVar6," - Number of tokens found: ");
                    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_f80);
                    dVar1 = (double)std::ostream::operator<<
                                              (poVar6,std::endl<char,std::char_traits<char>>);
                    Logger::log(dVar1);
                    std::__cxx11::stringstream::str();
                    std::operator<<(extraout_RAX_10,local_1818);
                    std::__cxx11::string::~string(local_1818);
                    std::__cxx11::stringstream::~stringstream(local_17f8);
                  }
                  data_00 = StringSplitter::get_abi_cxx11_
                                      ((StringSplitter *)&counterSinceLastParsing);
                  local_1819 = DataFilters::isFiltered(&(this->_options).filterRows,data_00);
                  if ((bool)local_1819) {
                    for (local_19d0 = 0;
                        (index = local_19d0, local_19d0 < (ulong)(long)local_14 &&
                        (local_19d0 < local_f80)); local_19d0 = local_19d0 + 1) {
                      pvVar7 = std::vector<DataPoint,_std::allocator<DataPoint>_>::at
                                         ((vector<DataPoint,_std::allocator<DataPoint>_> *)
                                          &dataMasked.
                                           super_vector<DataPoint,_std::allocator<DataPoint>_>.
                                           super__Vector_base<DataPoint,_std::allocator<DataPoint>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                          local_19d0);
                      bVar3 = StringSplitter::toValue<double>
                                        ((StringSplitter *)&counterSinceLastParsing,index,
                                         &pvVar7->value);
                      pvVar7 = std::vector<DataPoint,_std::allocator<DataPoint>_>::at
                                         ((vector<DataPoint,_std::allocator<DataPoint>_> *)
                                          &dataMasked.
                                           super_vector<DataPoint,_std::allocator<DataPoint>_>.
                                           super__Vector_base<DataPoint,_std::allocator<DataPoint>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                          local_19d0);
                      pvVar7->active = bVar3;
                      if (4 < (int)Logger::logLevel) {
                        std::__cxx11::stringstream::stringstream(local_1b58);
                        poVar6 = std::operator<<(local_1b48,"Line = ");
                        poVar6 = (ostream *)
                                 std::ostream::operator<<(poVar6,lineToReshape.field_2._12_4_);
                        poVar6 = std::operator<<(poVar6," - ");
                        pvVar7 = std::vector<DataPoint,_std::allocator<DataPoint>_>::at
                                           ((vector<DataPoint,_std::allocator<DataPoint>_> *)
                                            &dataMasked.
                                             super_vector<DataPoint,_std::allocator<DataPoint>_>.
                                             super__Vector_base<DataPoint,_std::allocator<DataPoint>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                            local_19d0);
                        pcVar5 = "Invalid token";
                        if ((pvVar7->active & 1U) != 0) {
                          pcVar5 = "Valid token";
                        }
                        poVar6 = std::operator<<(poVar6,pcVar5);
                        poVar6 = std::operator<<(poVar6," = ");
                        psVar8 = StringSplitter::at_abi_cxx11_
                                           ((StringSplitter *)&counterSinceLastParsing,local_19d0);
                        poVar6 = std::operator<<(poVar6,(string *)psVar8);
                        dVar1 = (double)std::ostream::operator<<
                                                  (poVar6,std::endl<char,std::char_traits<char>>);
                        Logger::log(dVar1);
                        std::__cxx11::stringstream::str();
                        std::operator<<(extraout_RAX_12,local_1b78);
                        std::__cxx11::string::~string(local_1b78);
                        std::__cxx11::stringstream::~stringstream(local_1b58);
                      }
                    }
                    local_1b79 = DataFilters::isFiltered
                                           (&(this->_options).filterRows,
                                            (DataVector *)
                                            &dataMasked.
                                             super_vector<DataPoint,_std::allocator<DataPoint>_>.
                                             super__Vector_base<DataPoint,_std::allocator<DataPoint>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    if ((bool)local_1b79) {
                      local_1d30 = (long)local_14;
                      local_1d38 = (long)local_18;
                      local_1d40 = (long)local_14;
                      DataVector::copy((EVP_PKEY_CTX *)
                                       &dataMasked.
                                        super_vector<DataPoint,_std::allocator<DataPoint>_>.
                                        super__Vector_base<DataPoint,_std::allocator<DataPoint>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (EVP_PKEY_CTX *)&local_1d30);
                      if (((this->_options).showFilteredData & 1U) != 0) {
                        stream = this->_outputStream;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_1d60," ",&local_1d61);
                        StatisticsWriter::writeData
                                  ((StatisticsWriter *)local_400,stream,(DataVector *)local_4c8,
                                   &local_1d60);
                        std::__cxx11::string::~string((string *)&local_1d60);
                        std::allocator<char>::~allocator(&local_1d61);
                      }
                      MultivariateTracker::update(&this->_tracker,(DataVector *)local_4c8);
                      DataVector::deactivate
                                ((DataVector *)
                                 &dataMasked.super_vector<DataPoint,_std::allocator<DataPoint>_>.
                                  super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage);
                      local_69c = 0;
                    }
                    else {
                      if (3 < (int)Logger::logLevel) {
                        std::__cxx11::stringstream::stringstream(local_1d08);
                        poVar6 = std::operator<<(local_1cf8,"Line = ");
                        poVar6 = (ostream *)
                                 std::ostream::operator<<(poVar6,lineToReshape.field_2._12_4_);
                        poVar6 = std::operator<<(poVar6," - filtered out by numeric filter");
                        dVar1 = (double)std::ostream::operator<<
                                                  (poVar6,std::endl<char,std::char_traits<char>>);
                        Logger::log(dVar1);
                        std::__cxx11::stringstream::str();
                        std::operator<<(extraout_RAX_13,local_1d28);
                        std::__cxx11::string::~string(local_1d28);
                        std::__cxx11::stringstream::~stringstream(local_1d08);
                      }
                      local_69c = 2;
                    }
                  }
                  else {
                    if (3 < (int)Logger::logLevel) {
                      std::__cxx11::stringstream::stringstream(local_19a8);
                      poVar6 = std::operator<<(local_1998,"Line = ");
                      poVar6 = (ostream *)
                               std::ostream::operator<<(poVar6,lineToReshape.field_2._12_4_);
                      poVar6 = std::operator<<(poVar6," - filtered out by string filter");
                      dVar1 = (double)std::ostream::operator<<
                                                (poVar6,std::endl<char,std::char_traits<char>>);
                      Logger::log(dVar1);
                      std::__cxx11::stringstream::str();
                      std::operator<<(extraout_RAX_11,(string *)&i);
                      std::__cxx11::string::~string((string *)&i);
                      std::__cxx11::stringstream::~stringstream(local_19a8);
                    }
                    local_69c = 2;
                  }
                }
                else {
                  if (4 < (int)Logger::logLevel) {
                    std::__cxx11::stringstream::stringstream(local_f28);
                    poVar6 = std::operator<<(local_f18,"Row not sampled. Skipping");
                    dVar1 = (double)std::ostream::operator<<
                                              (poVar6,std::endl<char,std::char_traits<char>>);
                    Logger::log(dVar1);
                    std::__cxx11::stringstream::str();
                    std::operator<<(extraout_RAX_05,local_f48);
                    std::__cxx11::string::~string(local_f48);
                    std::__cxx11::stringstream::~stringstream(local_f28);
                  }
                  local_69c = 2;
                }
              }
            }
            else {
              if (2 < (int)Logger::logLevel) {
                std::__cxx11::stringstream::stringstream(local_bd8);
                poVar6 = std::operator<<(local_bc8,"Skipping header line.");
                dVar1 = (double)std::ostream::operator<<
                                          (poVar6,std::endl<char,std::char_traits<char>>);
                Logger::log(dVar1);
                std::__cxx11::stringstream::str();
                std::operator<<(extraout_RAX_03,local_bf8);
                std::__cxx11::string::~string(local_bf8);
                std::__cxx11::stringstream::~stringstream(local_bd8);
              }
              local_69c = 2;
            }
          }
        }
      }
    }
LAB_00192c7d:
    std::__cxx11::string::~string((string *)local_4f0);
    stream_00 = extraout_RDX_00;
  } while ((local_69c == 0) || (local_69c == 2));
  sVar9 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&parser._tokens.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((long)local_18 != sVar9) {
    if (((this->_options).headerRow != 0) && (0 < (int)Logger::logLevel)) {
      std::__cxx11::stringstream::stringstream(local_1ef0);
      poVar6 = std::operator<<(local_1ee0,
                               "Size of header titles does not match data dimensions so using indices as header titles."
                              );
      dVar1 = (double)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      Logger::log(dVar1);
      std::__cxx11::stringstream::str();
      std::operator<<(extraout_RAX_14,local_1f10);
      std::__cxx11::string::~string(local_1f10);
      std::__cxx11::stringstream::~stringstream(local_1ef0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f30,"",(allocator<char> *)((long)&i_1 + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&parser._tokens.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_18,&local_1f30);
    std::__cxx11::string::~string((string *)&local_1f30);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
    for (local_1f40 = 0; (long)local_1f40 < (long)local_18; local_1f40 = local_1f40 + 1) {
      StringParser::parseNumber<long>((string *)&i_2,local_1f40 + 1,false);
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&parser._tokens.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,local_1f40);
      std::__cxx11::string::operator=((string *)pvVar10,(string *)&i_2);
      std::__cxx11::string::~string((string *)&i_2);
    }
  }
  local_1f68 = 0;
  while( true ) {
    sVar9 = local_1f68;
    bVar3 = false;
    if ((long)local_1f68 < (long)local_18) {
      lVar11 = MultivariateTracker::getDimension(&this->_tracker);
      bVar3 = (long)sVar9 < lVar11;
    }
    sVar9 = local_1f68;
    if (!bVar3) break;
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&parser._tokens.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,local_1f68);
    std::__cxx11::string::string((string *)&local_1f88,(string *)pvVar10);
    MultivariateTracker::setName(&this->_tracker,sVar9,&local_1f88);
    std::__cxx11::string::~string((string *)&local_1f88);
    local_1f68 = local_1f68 + 1;
  }
  if (2 < (int)Logger::logLevel) {
    std::__cxx11::stringstream::stringstream(local_2110);
    poVar6 = std::operator<<(local_2100,(string *)&ApplicationProperties::NAME_abi_cxx11_);
    poVar6 = std::operator<<(poVar6," is complete");
    dVar1 = (double)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    Logger::log(dVar1);
    std::__cxx11::stringstream::str();
    std::operator<<(extraout_RAX_15,local_2130);
    std::__cxx11::string::~string(local_2130);
    std::__cxx11::stringstream::~stringstream(local_2110);
  }
  local_69c = 1;
  DataVector::~DataVector((DataVector *)local_4c8);
  DataVector::~DataVector
            ((DataVector *)
             &dataMasked.super_vector<DataPoint,_std::allocator<DataPoint>_>.
              super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_490);
  StringSplitter::~StringSplitter((StringSplitter *)&counterSinceLastParsing);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&parser._tokens.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  StatisticsWriter::~StatisticsWriter((StatisticsWriter *)local_400);
  std::ifstream::~ifstream((ifstream *)&source);
  return 0;
}

Assistant:

int
    run(void)
    {

        // ==================================================
        // Application parameters
        // --------------------------------------------------
        int numDim = 0;
        int numDimMask = 0;

        // ==================================================
        // Define input stream
        // --------------------------------------------------
        std::ifstream fileInput(this->_options.fileInput.c_str(), std::ios::in);
        std::istream * source = (fileInput.good() ? &fileInput : &std::cin);

        LOG_MESSAGE(Logger::Level::INFO, ApplicationProperties::NAME << " is starting");

        // ==================================================
        // Define output writer
        // --------------------------------------------------
        StatisticsWriter writer;

        // ==================================================
        // Define row sampler
        // --------------------------------------------------
        RowSampler sampler(this->_options.sampling);

        // ==================================================
        // Loop through source data
        // --------------------------------------------------
        
        // titles is populated by parsed line if user provides a titles row, otherwise indices are used
        std::vector<std::string> titles;
        StringSplitter parser;
        
        // Counters used to keep track of line reads if reshaping is requested by user
        unsigned int counter = 0;
        unsigned int counterSinceLastParsing = 0;
        std::string lineToReshape = "";
        
        // DataVector contains the parsed data from each line.
        // It's size will get set on the first successful parsing.
        DataVector data;
        DataVector dataMasked;
        
        bool reading = true;
        while (reading)
        {

            // ==================================================
            // Extract current line
            // --------------------------------------------------
            std::string line = StatisticsApp::readline(*source);
            if (!(*source).good())
            {
                LOG_MESSAGE(Logger::Level::DETAIL, "End of file found. Exiting.");
                break;
            }

            // ==================================================
            // Check if line is empty and if we need to exit
            // --------------------------------------------------
            if (line.size() == 0)
            {
                if (this->_options.blankEOF)
                {
                    LOG_MESSAGE(Logger::Level::DETAIL, "Blank line found. Exiting.");
                    break;
                }
                else
                {
                    LOG_MESSAGE(Logger::Level::DETAIL, "Blank line found. Skipping.");
                    continue;
                }
            }
            
            // ==================================================
            // Check if row is comment and needs to be skipped
            // --------------------------------------------------
            if (line.compare(0,1,this->_options.comment.c_str()) == 0) continue;
            
            // ==================================================
            // Check if row needs to be reshaped into column
            // --------------------------------------------------

            // If yes, then append current line to previous
            // lines with delimiter and continue to next read
            counterSinceLastParsing++;
            lineToReshape += (counterSinceLastParsing == 1 ? "" : this->_options.delimiter) + line;
            if (counterSinceLastParsing < this->_options.numLinesToReshape) continue;

            // Prepare line and counter for parsing
            line = lineToReshape;
            counter++;

            // Reset counter and appended line for next read
            counterSinceLastParsing = 0;
            lineToReshape = "";

            // ==================================================
            // Extract header titles
            // --------------------------------------------------
            if (this->_options.headerRow == counter)
            {
                parser.initialize(line, this->_options.delimiter, this->_options.removeDuplicates, this->_options.filterColumns);
                titles = parser.tokens();
                continue;
            }
            
            // ==================================================
            // Skip header rows
            // --------------------------------------------------
            if (counter <= this->_options.numLinesToSkip)
            {
                LOG_MESSAGE(Logger::Level::INFO, "Skipping header line.");
                continue;
            }

            // ==================================================
            // Skip unneeded rows
            // --------------------------------------------------
            if (counter > (this->_options.numLinesToSkip + this->_options.numLinesToKeep))
            {
                LOG_MESSAGE(Logger::Level::INFO, "Skipping remaining lines.");
                break;
            }

            // ==================================================
            // Skip unsampled rows
            // --------------------------------------------------
            if (!sampler.sample())
            {
                LOG_MESSAGE(Logger::Level::DETAIL, "Row not sampled. Skipping");
                continue;
            }

            // ==================================================
            // Parse current line
            // --------------------------------------------------
            parser.initialize(line, this->_options.delimiter, this->_options.removeDuplicates);
            StringSplitter::size_type numTokens = parser.size();
            LOG_MESSAGE(Logger::Level::DETAIL, "Line = " << counter << " - content =\"" << line << "\"");

            // ==================================================
            // Check and compute source data dimensions
            // --------------------------------------------------
            bool isDimSet = numDim > 0;
            if (!isDimSet)
            {
                numDim = (int) numTokens;
                data.resize(numDim);

                // Make sure we only keep column filters if they are within actual number of columns
                this->_options.filterColumns.resize(numDim, (this->_options.filterColumns.size() == 0));

                // Compute how many columns are masked out
                numDimMask = std::accumulate(this->_options.filterColumns.begin(), this->_options.filterColumns.end(), 0);
                dataMasked.resize(numDimMask);

                LOG_MESSAGE(Logger::Level::INFO, "Data dimensions set to " << numDim);
                LOG_MESSAGE(Logger::Level::INFO, "Mask dimensions set to " << numDimMask);
            }

            bool isDimFailed = (numDim != (int) numTokens);
            if (isDimFailed)
            {
                LOG_MESSAGE(Logger::Level::WARNING, "Line = " << counter << " - Statistics dimensions does not equal data dimensions." << (this->_options.strictParsing ? " Skipping." : ""));
                if (this->_options.strictParsing)
                {
                    continue;
                }
            }

            LOG_MESSAGE(Logger::Level::DEBUG, "Line = " << counter << " - Number of tokens found: " << numTokens);

            // ==================================================
            // Apply string filters
            // --------------------------------------------------
            bool isStringFiltered = this->_options.filterRows.isFiltered(parser.get());
            if (!isStringFiltered)
            {
                LOG_MESSAGE(Logger::Level::DEBUG, "Line = " << counter << " - filtered out by string filter");
                continue;
            }

            // ==================================================
            // Convert tokens into data array
            // --------------------------------------------------
            for (StringSplitter::size_type i = 0; i < (StringSplitter::size_type) numDim; ++i)
            {

                if (numTokens <= i) break;

                data.at(i).active = parser.toValue<double>(i, data.at(i).value);

                LOG_MESSAGE(Logger::Level::DETAIL, "Line = " << counter << " - " << (data.at(i).active ? "Valid token" : "Invalid token") << " = " << parser.at(i));

            }

            // ==================================================
            // Apply numeric filters
            // --------------------------------------------------
            bool isNumericFiltered = this->_options.filterRows.isFiltered(data);
            if (!isNumericFiltered)
            {
                LOG_MESSAGE(Logger::Level::DEBUG, "Line = " << counter << " - filtered out by numeric filter");
                continue;
            }

            // ==================================================
            // Apply column filters
            // --------------------------------------------------
            DataVector::copy(data, numDim, dataMasked, numDimMask, this->_options.filterColumns, numDim);

            // ==================================================
            // Write current data
            // --------------------------------------------------
            if (this->_options.showFilteredData)
            {
                writer.writeData(*this->_outputStream, dataMasked);
            }

            // ==================================================
            // Update statistics with current data
            // --------------------------------------------------
            this->_tracker.update(dataMasked);

            // Since the data vector is preallocated, we deactivate all entries in case they don't exist in the next parsed line
            // This way they don't get inadvertently included in the next line's statistics
            data.deactivate();

        }

        // ==================================================
        // Update statistics names
        // --------------------------------------------------
        if (numDimMask != (long)titles.size())
        {
            // Show error message if user provided a bad header row
            if (this->_options.headerRow > 0)
            {
                LOG_MESSAGE(Logger::Level::ERROR, "Size of header titles does not match data dimensions so using indices as header titles.");
            }
            titles.resize(numDimMask,"");
            for (long i = 0; i < numDimMask; i++)
            {
                titles.at(i) = StringParser::parseNumber<long>(i+1);
            }
        }
        for (long i = 0; i < numDimMask && i < this->_tracker.getDimension(); i++)
        {
            this->_tracker.setName(i, titles.at(i));
        }

        LOG_MESSAGE(Logger::Level::INFO, ApplicationProperties::NAME << " is complete");
    
        return 0;
        
    }